

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

bool __thiscall
OpenMD::ZConstraintForceModifier::isZMol(ZConstraintForceModifier *this,Molecule *mol)

{
  bool bVar1;
  Molecule *in_RSI;
  map<int,_OpenMD::ZconstraintParam,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZconstraintParam>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  int local_1c;
  _Self local_18 [3];
  
  local_1c = Molecule::getGlobalIndex(in_RSI);
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_OpenMD::ZconstraintParam,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZconstraintParam>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x32049b);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_OpenMD::ZconstraintParam,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZconstraintParam>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator==(local_18,&local_28);
  return (bool)(bVar1 - 1U & 1);
}

Assistant:

bool ZConstraintForceModifier::isZMol(Molecule* mol) {
    return allZMolIndices_.find(mol->getGlobalIndex()) ==
                   allZMolIndices_.end() ?
               false :
               true;
  }